

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlCharacters(xmlParserCtxtPtr ctxt,xmlChar *buf,int size)

{
  int iVar1;
  int size_local;
  xmlChar *buf_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) {
    if ((ctxt->keepBlanks == 0) &&
       ((ctxt->sax->ignorableWhitespace != ctxt->sax->characters &&
        (iVar1 = areBlanks(ctxt,buf,size,1), iVar1 != 0)))) {
      if (ctxt->sax->ignorableWhitespace != (ignorableWhitespaceSAXFunc)0x0) {
        (*ctxt->sax->ignorableWhitespace)(ctxt->userData,buf,size);
      }
    }
    else {
      if (ctxt->sax->characters != (charactersSAXFunc)0x0) {
        (*ctxt->sax->characters)(ctxt->userData,buf,size);
      }
      if ((ctxt->keepBlanks == 0) && (*ctxt->space == -1)) {
        *ctxt->space = -2;
      }
    }
  }
  return;
}

Assistant:

static void
xmlCharacters(xmlParserCtxtPtr ctxt, const xmlChar *buf, int size) {
    if ((ctxt->sax == NULL) || (ctxt->disableSAX))
        return;

    /*
     * Calling areBlanks with only parts of a text node
     * is fundamentally broken, making the NOBLANKS option
     * essentially unusable.
     */
    if ((!ctxt->keepBlanks) &&
        (ctxt->sax->ignorableWhitespace != ctxt->sax->characters) &&
        (areBlanks(ctxt, buf, size, 1))) {
        if (ctxt->sax->ignorableWhitespace != NULL)
            ctxt->sax->ignorableWhitespace(ctxt->userData, buf, size);
    } else {
        if (ctxt->sax->characters != NULL)
            ctxt->sax->characters(ctxt->userData, buf, size);

        /*
         * The old code used to update this value for "complex" data
         * even if keepBlanks was true. This was probably a bug.
         */
        if ((!ctxt->keepBlanks) && (*ctxt->space == -1))
            *ctxt->space = -2;
    }
}